

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrFutureStateEXT value)

{
  pointer pbVar1;
  string *psVar2;
  string *command_name_00;
  int iVar3;
  pointer pbVar4;
  bool bVar5;
  string vuid;
  string error_str;
  string local_a8;
  string *local_88;
  string *local_80;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *local_78;
  string *local_70;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_68;
  string local_50;
  
  if (instance_info != (GenValidUsageXrInstanceInfo *)0x0) {
    pbVar4 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = pbVar4 != pbVar1;
    local_88 = item_name;
    local_80 = command_name;
    local_78 = objects_info;
    local_70 = validation_name;
    if (bVar5) {
      iVar3 = std::__cxx11::string::compare((char *)pbVar4);
      while (iVar3 != 0) {
        pbVar4 = pbVar4 + 1;
        bVar5 = pbVar4 != pbVar1;
        if (pbVar4 == pbVar1) break;
        iVar3 = std::__cxx11::string::compare((char *)pbVar4);
      }
    }
    command_name_00 = local_80;
    psVar2 = local_88;
    if (!bVar5) {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"VUID-","");
      std::__cxx11::string::_M_append((char *)&local_a8,(ulong)(local_70->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_a8);
      std::__cxx11::string::_M_append((char *)&local_a8,(ulong)(psVar2->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_a8);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"XrFutureStateEXT requires extension ","");
      std::__cxx11::string::append((char *)&local_50);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_68,local_78);
      CoreValidLogMessage(instance_info,&local_a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name_00,
                          &local_68,&local_50);
      if (local_68.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      return false;
    }
  }
  return value - XR_FUTURE_STATE_PENDING_EXT < 2;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrFutureStateEXT value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    // Enum requires extension XR_EXT_future, so check that it is enabled
    if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_EXT_future")) {
        std::string vuid = "VUID-";
        vuid += validation_name;
        vuid += "-";
        vuid += item_name;
        vuid += "-parameter";
        std::string error_str = "XrFutureStateEXT requires extension ";
        error_str += " \"XR_EXT_future\" to be enabled, but it is not enabled";
        CoreValidLogMessage(instance_info, vuid,
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, error_str);
        return false;
    }
    switch (value) {
        case XR_FUTURE_STATE_PENDING_EXT:
            return true;
        case XR_FUTURE_STATE_READY_EXT:
            return true;
    default:
        return false;
}
}